

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnCatch(TypeChecker *this,TypeVector *sig)

{
  LabelType LVar1;
  Type *pTVar2;
  Result RVar3;
  Result RVar4;
  Enum EVar5;
  Type *pTVar6;
  Label *label;
  Label *local_38;
  
  RVar3 = GetLabel(this,0,&local_38);
  EVar5 = Error;
  if (RVar3.enum_ != Error) {
    LVar1 = local_38->label_type;
    RVar3 = PopAndCheckSignature(this,&local_38->result_types,"try block");
    RVar4 = CheckTypeStackEnd(this,"try block");
    EVar5 = (Enum)((RVar4.enum_ == Error || RVar3.enum_ == Error) || LVar1 + ~Catch < 0xfffffffe);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
              (&this->type_stack_,local_38->type_stack_limit);
    local_38->label_type = Catch;
    local_38->unreachable = false;
    pTVar2 = (sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar6 = (sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                  super__Vector_impl_data._M_start; pTVar6 != pTVar2; pTVar6 = pTVar6 + 1) {
      PushType(this,*pTVar6);
    }
  }
  return (Result)EVar5;
}

Assistant:

Result TypeChecker::OnCatch(const TypeVector& sig) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  result |= Check2LabelTypes(label, LabelType::Try, LabelType::Catch);
  result |= PopAndCheckSignature(label->result_types, "try block");
  result |= CheckTypeStackEnd("try block");
  ResetTypeStackToLabel(label);
  label->label_type = LabelType::Catch;
  label->unreachable = false;
  PushTypes(sig);
  return result;
}